

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_41304e::SeedStartup(CSHA512 *hasher,RNGState *rng)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  milliseconds dur;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  string_view in_stack_00000030;
  uint64_t old_size;
  CSHA512 *in_stack_000000a8;
  Level in_stack_00000110;
  unsigned_long *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  RNGState *in_stack_ffffffffffffff78;
  CSHA512 *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SeedHardwareSlow((CSHA512 *)in_stack_ffffffffffffff78);
  SeedSlow((CSHA512 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
           (RNGState *)0x3bffcb);
  uVar3 = CSHA512::Size((CSHA512 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  RandAddDynamicEnv(in_stack_ffffffffffffff80);
  RandAddStaticEnv(in_stack_000000a8);
  bVar2 = LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    uVar4 = CSHA512::Size((CSHA512 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    in_stack_ffffffffffffff78 = (RNGState *)&stack0xffffffffffffffd0;
    in_stack_ffffffffffffff70 = "Feeding %i bytes of environment data into RNG\n";
    in_stack_ffffffffffffff68 = 1;
    LogPrintFormatInternal<unsigned_long>
              (in_stack_00000030,(string_view)in_stack_00000020,in_stack_ffffffffffffffdc,
               uVar4 - uVar3,in_stack_00000110,in_stack_00000018,in_stack_00000120);
  }
  dur = ms<(char)49,(char)48,(char)48>();
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff70,
             (duration<long,_std::ratio<1L,_1000L>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SeedStrengthen(in_RDI,in_stack_ffffffffffffff78,(duration)dur.__r);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SeedStartup(CSHA512& hasher, RNGState& rng) noexcept
{
    // Gather 256 bits of hardware randomness, if available
    SeedHardwareSlow(hasher);

    // Everything that the 'slow' seeder includes.
    SeedSlow(hasher, rng);

    // Dynamic environment data (performance monitoring, ...)
    auto old_size = hasher.Size();
    RandAddDynamicEnv(hasher);

    // Static environment data
    RandAddStaticEnv(hasher);
    LogDebug(BCLog::RAND, "Feeding %i bytes of environment data into RNG\n", hasher.Size() - old_size);

    // Strengthen for 100 ms
    SeedStrengthen(hasher, rng, 100ms);
}